

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iinq.c
# Opt level: O0

ion_err_t iinq_drop(char *schema_file_name)

{
  undefined1 local_88 [8];
  ion_dictionary_handler_t handler;
  ion_dictionary_t dictionary;
  ion_err_t error;
  char *schema_file_name_local;
  
  schema_file_name_local._7_1_ =
       iinq_open_source(schema_file_name,(ion_dictionary_t *)&handler.close_dictionary,
                        (ion_dictionary_handler_t *)local_88);
  if (schema_file_name_local._7_1_ == '\0') {
    schema_file_name_local._7_1_ =
         dictionary_delete_dictionary((ion_dictionary_t *)&handler.close_dictionary);
    remove(schema_file_name);
  }
  return schema_file_name_local._7_1_;
}

Assistant:

ion_err_t
iinq_drop(
	char *schema_file_name
) {
	ion_err_t					error;
	ion_dictionary_t			dictionary;
	ion_dictionary_handler_t	handler;

	dictionary.handler	= &handler;

	error				= iinq_open_source(schema_file_name, &dictionary, &handler);

	if (err_ok != error) {
		return error;
	}

	error = dictionary_delete_dictionary(&dictionary);

	fremove(schema_file_name);

	return error;
}